

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

string * cmSystemTools::EncodeURL(string *__return_storage_ptr__,string *in,bool escapeSlashes)

{
  bool bVar1;
  int iVar2;
  byte *pbVar3;
  uint local_40;
  byte local_39;
  char hexCh [4];
  char c;
  const_iterator __end1;
  const_iterator __begin1;
  string *__range1;
  bool escapeSlashes_local;
  string *in_local;
  string *out;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  __end1._M_current = (char *)std::__cxx11::string::begin();
  _hexCh = (char *)std::__cxx11::string::end();
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)hexCh);
    if (!bVar1) {
      return __return_storage_ptr__;
    }
    pbVar3 = (byte *)__gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&__end1);
    local_39 = *pbVar3;
    local_40 = (uint)local_39;
    iVar2 = (int)(char)local_39;
    if (((iVar2 == 0x20) || (iVar2 - 0x25U < 2)) || (iVar2 == 0x2b)) {
LAB_001c332b:
      sprintf((char *)&local_40,"%%%02X",(ulong)(uint)(int)(char)local_39);
    }
    else if (iVar2 == 0x2f) {
      if (escapeSlashes) {
        strcpy((char *)&local_40,"%2F");
      }
    }
    else if (((iVar2 == 0x3d) || (iVar2 == 0x3f)) || (iVar2 == 0x5c)) goto LAB_001c332b;
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

std::string cmSystemTools::EncodeURL(std::string const& in, bool escapeSlashes)
{
  std::string out;
  for (char c : in) {
    char hexCh[4] = { 0, 0, 0, 0 };
    hexCh[0] = c;
    switch (c) {
      case '+':
      case '?':
      case '\\':
      case '&':
      case ' ':
      case '=':
      case '%':
        sprintf(hexCh, "%%%02X", static_cast<int>(c));
        break;
      case '/':
        if (escapeSlashes) {
          strcpy(hexCh, "%2F");
        }
        break;
      default:
        break;
    }
    out.append(hexCh);
  }
  return out;
}